

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O0

void Lpk_ComposeSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nVars,int iCofVar,Lpk_Set_t *pStore,
                    int *pSize,int nSizeLimit)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uWord;
  int iVar6;
  Lpk_Set_t *pLVar7;
  Lpk_Set_t *pEntry;
  uint uSuppTotal;
  uint uSupp1;
  uint uSupp0;
  uint uSupp;
  uint Entry1;
  uint Entry0;
  uint Entry;
  int s;
  int k;
  int i;
  int nMinOver;
  int nUsed;
  int nSuppRed;
  int nSuppOver;
  int nSuppSize;
  int *pSize_local;
  Lpk_Set_t *pStore_local;
  int iCofVar_local;
  int nVars_local;
  Vec_Int_t *vSets1_local;
  Vec_Int_t *vSets0_local;
  
  if (Lpk_ComposeSets::nTravId == 0x40000000) {
    memset(Lpk_ComposeSets::TravId,0,0x40000);
  }
  i = 0;
  Lpk_ComposeSets::nTravId = Lpk_ComposeSets::nTravId + 1;
  uVar1 = Kit_BitMask(nVars);
  for (s = 0; iVar2 = Vec_IntSize(vSets0), s < iVar2; s = s + 1) {
    uVar3 = Vec_IntEntry(vSets0,s);
    for (Entry = 0; iVar2 = Vec_IntSize(vSets1), (int)Entry < iVar2; Entry = Entry + 1) {
      uVar4 = Vec_IntEntry(vSets1,Entry);
      uVar5 = uVar3 & 0xffff;
      uWord = uVar4 & 0xffff;
      if ((((uVar5 != 0) && (uWord != 0)) &&
          ((uVar5 | uWord) != (uVar1 & (1 << ((byte)iCofVar & 0x1f) ^ 0xffffffffU)))) &&
         ((iVar2 = Kit_WordHasOneBit(uVar5), iVar2 == 0 ||
          (iVar2 = Kit_WordHasOneBit(uWord), iVar2 == 0)))) {
        uVar4 = uVar3 | uVar4;
        uVar5 = uVar4 & 0xffff;
        iVar2 = Kit_WordCountOnes(uVar5);
        iVar6 = Kit_WordCountOnes(uVar4 & uVar4 >> 0x10);
        iVar2 = (iVar2 + -1) - iVar6;
        if (0 < iVar2) {
          if (Lpk_ComposeSets::TravId[uVar5] < Lpk_ComposeSets::nTravId) {
            Lpk_ComposeSets::Used[i] = (unsigned_short)uVar4;
            Lpk_ComposeSets::TravId[uVar5] = Lpk_ComposeSets::nTravId;
            Lpk_ComposeSets::SRed[uVar5] = (char)iVar2;
            Lpk_ComposeSets::Over[uVar5] = (char)iVar6;
            Lpk_ComposeSets::Parents[uVar5] = Entry << 0x10 | s;
            i = i + 1;
          }
          else if ((Lpk_ComposeSets::TravId[uVar5] == Lpk_ComposeSets::nTravId) &&
                  (Lpk_ComposeSets::SRed[uVar5] < iVar2)) {
            Lpk_ComposeSets::TravId[uVar5] = Lpk_ComposeSets::nTravId;
            Lpk_ComposeSets::SRed[uVar5] = (char)iVar2;
            Lpk_ComposeSets::Over[uVar5] = (char)iVar6;
            Lpk_ComposeSets::Parents[uVar5] = Entry << 0x10 | s;
          }
        }
      }
    }
  }
  k = 1000;
  for (Entry0 = 0; (int)Entry0 < i; Entry0 = Entry0 + 1) {
    if (Lpk_ComposeSets::Over[Lpk_ComposeSets::Used[(int)Entry0]] < k) {
      k = (int)Lpk_ComposeSets::Over[Lpk_ComposeSets::Used[(int)Entry0]];
    }
  }
  Entry0 = 0;
  do {
    if (i <= (int)Entry0) {
      return;
    }
    if (Lpk_ComposeSets::Over[Lpk_ComposeSets::Used[(int)Entry0]] == k) {
      if (*pSize == nSizeLimit) {
        return;
      }
      iVar2 = *pSize;
      *pSize = iVar2 + 1;
      pLVar7 = pStore + iVar2;
      uVar1 = Lpk_ComposeSets::Parents[Lpk_ComposeSets::Used[(int)Entry0]];
      uVar3 = Vec_IntEntry(vSets0,Lpk_ComposeSets::Parents[Lpk_ComposeSets::Used[(int)Entry0]] &
                                  0xffff);
      pLVar7->uSubset0 = uVar3;
      uVar1 = Vec_IntEntry(vSets1,uVar1 >> 0x10);
      pLVar7->uSubset1 = uVar1;
      uVar1 = pLVar7->uSubset0 | pLVar7->uSubset1;
      pLVar7->iVar = (byte)iCofVar;
      iVar2 = Kit_WordCountOnes(uVar1 & 0xffff);
      pLVar7->Size = (char)iVar2;
      iVar2 = Kit_WordCountOnes(uVar1 & uVar1 >> 0x10);
      pLVar7->Over = (char)iVar2;
      pLVar7->SRed = (pLVar7->Size + -1) - pLVar7->Over;
      if (pLVar7->SRed < '\x01') {
        __assert_fail("pEntry->SRed > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkSets.c"
                      ,0x11a,
                      "void Lpk_ComposeSets(Vec_Int_t *, Vec_Int_t *, int, int, Lpk_Set_t *, int *, int)"
                     );
      }
    }
    Entry0 = Entry0 + 1;
  } while( true );
}

Assistant:

void Lpk_ComposeSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nVars, int iCofVar,
    Lpk_Set_t * pStore, int * pSize, int nSizeLimit )
{
    static int nTravId = 0;            // the number of the times this is visited
    static int TravId[1<<16] = {0};    // last visited
    static char SRed[1<<16];           // best support reduction
    static char Over[1<<16];           // best overlaps
    static unsigned Parents[1<<16];    // best set of parents
    static unsigned short Used[1<<16]; // storage for used subsets
    int nSuppSize, nSuppOver, nSuppRed, nUsed, nMinOver, i, k, s;
    unsigned Entry, Entry0, Entry1;
    unsigned uSupp, uSupp0, uSupp1, uSuppTotal;
    Lpk_Set_t * pEntry;

    if ( nTravId == (1 << 30) )
        memset( TravId, 0, sizeof(int) * (1 << 16) );

    // collect support reducing subsets
    nUsed = 0;
    nTravId++;
    uSuppTotal = Kit_BitMask(nVars) & ~(1<<iCofVar);
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        uSupp0 = (Entry0 & 0xFFFF);
        uSupp1 = (Entry1 & 0xFFFF);
        // skip trivial
        if ( uSupp0 == 0 || uSupp1 == 0 || (uSupp0 | uSupp1) == uSuppTotal )
            continue;
        if ( Kit_WordHasOneBit(uSupp0) && Kit_WordHasOneBit(uSupp1) )
            continue;
        // get the entry
        Entry = Entry0 | Entry1;
        uSupp = Entry & 0xFFFF;
        // set the bound set size
        nSuppSize = Kit_WordCountOnes( uSupp );
        // get the number of overlapping vars
        nSuppOver = Kit_WordCountOnes( Entry & (Entry >> 16) );
        // get the support reduction
        nSuppRed  = nSuppSize - 1 - nSuppOver;
        // only consider support-reducing subsets
        if ( nSuppRed <= 0 )
            continue;
        // check if this support is already used
        if ( TravId[uSupp] < nTravId )
        {
            Used[nUsed++] = uSupp;

            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
        else if ( TravId[uSupp] == nTravId && SRed[uSupp] < nSuppRed )
        {
            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
    }

    // find the minimum overlap
    nMinOver = 1000;
    for ( s = 0; s < nUsed; s++ )
        if ( nMinOver > Over[Used[s]] )
            nMinOver = Over[Used[s]];


    // collect the accumulated ones
    for ( s = 0; s < nUsed; s++ )
        if ( Over[Used[s]] == nMinOver )
        {
            // save the entry
            if ( *pSize == nSizeLimit )
                return;
            pEntry = pStore + (*pSize)++;

            i = Parents[Used[s]] & 0xFFFF;
            k = Parents[Used[s]] >> 16;

            pEntry->uSubset0 = Vec_IntEntry(vSets0, i);
            pEntry->uSubset1 = Vec_IntEntry(vSets1, k);
            Entry  = pEntry->uSubset0 | pEntry->uSubset1;

            // record the cofactoring variable
            pEntry->iVar = iCofVar;
            // set the bound set size
            pEntry->Size = Kit_WordCountOnes( Entry & 0xFFFF );
            // get the number of overlapping vars
            pEntry->Over = Kit_WordCountOnes( Entry & (Entry >> 16) );
            // get the support reduction
            pEntry->SRed = pEntry->Size - 1 - pEntry->Over;
            assert( pEntry->SRed > 0 );
        }
}